

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O2

tuple<SudokuGitter,_SudokuGitter> * __thiscall
SudokuGenerator::generateNewBig
          (tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,SudokuGenerator *this)

{
  SudokuGenerator *pSVar1;
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  local_80;
  SudokuGitter untenRechts;
  SudokuGitter linksOben;
  
  pSVar1 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar1,this->elementCount);
  generateNew(&untenRechts,pSVar1);
  pSVar1 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar1,this->elementCount);
  SudokuGitter::getQuad
            (&local_80,&untenRechts,(this->gitter).quadHeight - 1,(this->gitter).quadWidth - 1);
  SudokuGitter::setQuadPermanent(&pSVar1->gitter,0,0,&local_80);
  std::
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  ::~vector(&local_80);
  generateNewFromRow(&linksOben,pSVar1,0);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_Tuple_impl<SudokuGitter&,SudokuGitter&,void>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)__return_storage_ptr__,&untenRechts,
             &linksOben);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&linksOben.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&untenRechts.cells);
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> SudokuGenerator::generateNewBig() {
    SudokuGenerator *untenRechtsGen = new SudokuGenerator(elementCount);
    SudokuGitter untenRechts = untenRechtsGen->generateNew();

    SudokuGenerator *linksObenGen = new SudokuGenerator(elementCount);
    linksObenGen->gitter.setQuadPermanent(0, 0,
                                          untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1));
    SudokuGitter linksOben = linksObenGen->generateNewFromRow(0);

    //printCelVecValPtr(untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1), "LinksObenUebernehmen");

    return tuple<SudokuGitter, SudokuGitter>(untenRechts, linksOben);
}